

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

void __thiscall S2LatLngRect::Encode(S2LatLngRect *this,Encoder *encoder)

{
  Encoder::Ensure(encoder,0x28);
  Encoder::put8(encoder,'\x01');
  Encoder::put64(encoder,(uint64)(this->lat_).bounds_.c_[0]);
  Encoder::put64(encoder,(uint64)(this->lat_).bounds_.c_[1]);
  Encoder::put64(encoder,(uint64)(this->lng_).bounds_.c_[0]);
  Encoder::put64(encoder,(uint64)(this->lng_).bounds_.c_[1]);
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2LatLngRect::Encode(Encoder* encoder) const {
  encoder->Ensure(40);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->putdouble(lat_.lo());
  encoder->putdouble(lat_.hi());
  encoder->putdouble(lng_.lo());
  encoder->putdouble(lng_.hi());

  S2_DCHECK_GE(encoder->avail(), 0);
}